

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O1

QString * __thiscall
DebugDirCVEntryWrapper::getSignature(QString *__return_storage_ptr__,DebugDirCVEntryWrapper *this)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int iVar4;
  undefined4 extraout_var;
  QByteArrayView QVar5;
  QArrayData *local_30;
  char16_t *local_28;
  qsizetype local_20;
  
  iVar4 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])(this);
  if (CONCAT44(extraout_var,iVar4) == 0) {
    QVar5.m_data = (storage_type *)0x0;
    QVar5.m_size = (qsizetype)&local_30;
    QString::fromUtf8(QVar5);
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = (Data *)local_30;
    (__return_storage_ptr__->d).ptr = local_28;
    (__return_storage_ptr__->d).size = local_20;
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    QString::asprintf((char *)&local_30,"%.4s",CONCAT44(extraout_var,iVar4));
    pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    (__return_storage_ptr__->d).d = (Data *)local_30;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).ptr = local_28;
    qVar3 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_20;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        local_30 = pQVar1;
        local_28 = pcVar2;
        local_20 = qVar3;
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString DebugDirCVEntryWrapper::getSignature()
{
    DEBUG_RSDSI* rdsi = (DEBUG_RSDSI*)this->getPtr();
    if (!rdsi) return "";

    QString out;
#if QT_VERSION >= 0x050000
    out = QString().asprintf("%.4s", (char*)&rdsi->dwSig);
#else
    out = QString().sprintf("%.4s", (char*)&rdsi->dwSig);
#endif
    return out;
}